

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.hpp
# Opt level: O3

void __thiscall
CLI::ConversionError::ConversionError
          (ConversionError *this,string *ConversionError,string *msg,ExitCodes exit_code)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string local_58;
  string local_38;
  
  local_58._M_dataplus._M_p = (ConversionError->_M_dataplus)._M_p;
  paVar1 = &ConversionError->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p == paVar1) {
    local_58.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_58.field_2._8_8_ = *(undefined8 *)((long)&ConversionError->field_2 + 8);
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  }
  else {
    local_58.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_58._M_string_length = ConversionError->_M_string_length;
  (ConversionError->_M_dataplus)._M_p = (pointer)paVar1;
  ConversionError->_M_string_length = 0;
  (ConversionError->field_2)._M_local_buf[0] = '\0';
  local_38._M_dataplus._M_p = (msg->_M_dataplus)._M_p;
  paVar1 = &msg->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p == paVar1) {
    local_38.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_38.field_2._8_8_ = *(undefined8 *)((long)&msg->field_2 + 8);
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  }
  else {
    local_38.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_38._M_string_length = msg->_M_string_length;
  (msg->_M_dataplus)._M_p = (pointer)paVar1;
  msg->_M_string_length = 0;
  (msg->field_2)._M_local_buf[0] = '\0';
  ParseError::ParseError(&this->super_ParseError,&local_58,&local_38,exit_code);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  *(undefined ***)&(this->super_ParseError).super_Error = &PTR__Error_00171a80;
  return;
}

Assistant:

ConversionError(std::string member, std::string name)
        : ConversionError("The value " + member + "is not an allowed value for " + name) {}